

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scene.cpp
# Opt level: O1

string * __thiscall
pbrt::syntactic::ParamSet::getParamString
          (string *__return_storage_ptr__,ParamSet *this,string *name)

{
  _Base_ptr this_00;
  const_iterator cVar1;
  long *plVar2;
  long lVar3;
  runtime_error *prVar4;
  long *plVar5;
  _Base_ptr this_01;
  long *local_70;
  long local_68;
  long local_60;
  long lStack_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  cVar1 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::syntactic::Param>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::syntactic::Param>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::syntactic::Param>_>_>_>
          ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::syntactic::Param>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::syntactic::Param>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::syntactic::Param>_>_>_>
                  *)this,name);
  if ((_Rb_tree_header *)cVar1._M_node == &(this->param)._M_t._M_impl.super__Rb_tree_header) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
  }
  else {
    lVar3 = *(long *)(cVar1._M_node + 2);
    this_00 = cVar1._M_node[2]._M_parent;
    if (this_00 != (_Base_ptr)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        *(int *)&this_00->_M_parent = *(int *)&this_00->_M_parent + 1;
        UNLOCK();
      }
      else {
        *(int *)&this_00->_M_parent = *(int *)&this_00->_M_parent + 1;
      }
    }
    if (lVar3 == 0) {
      plVar2 = (long *)0x0;
    }
    else {
      plVar2 = (long *)__dynamic_cast(lVar3,&Param::typeinfo,
                                      &ParamArray<std::__cxx11::string>::typeinfo,0);
    }
    this_01 = this_00;
    if (plVar2 == (long *)0x0) {
      this_01 = (_Base_ptr)0x0;
    }
    if (plVar2 != (long *)0x0 && this_00 != (_Base_ptr)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        *(int *)&this_00->_M_parent = *(int *)&this_00->_M_parent + 1;
        UNLOCK();
        this_01 = this_00;
      }
      else {
        *(int *)&this_00->_M_parent = *(int *)&this_00->_M_parent + 1;
        this_01 = this_00;
      }
    }
    if (plVar2 == (long *)0x0) {
      prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::operator+(&local_50,"str: found param of given name (",name);
      plVar2 = (long *)std::__cxx11::string::append((char *)&local_50);
      local_70 = (long *)*plVar2;
      plVar5 = plVar2 + 2;
      if (local_70 == plVar5) {
        local_60 = *plVar5;
        lStack_58 = plVar2[3];
        local_70 = &local_60;
      }
      else {
        local_60 = *plVar5;
      }
      local_68 = plVar2[1];
      *plVar2 = (long)plVar5;
      plVar2[1] = 0;
      *(undefined1 *)(plVar2 + 2) = 0;
      std::runtime_error::runtime_error(prVar4,(string *)&local_70);
      __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    lVar3 = (**(code **)(*plVar2 + 8))(plVar2);
    if (lVar3 != 1) {
      prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::operator+(&local_50,
                     "found param of given name and type, but wrong number of components! (str, name=\'"
                     ,name);
      plVar2 = (long *)std::__cxx11::string::append((char *)&local_50);
      local_70 = (long *)*plVar2;
      plVar5 = plVar2 + 2;
      if (local_70 == plVar5) {
        local_60 = *plVar5;
        lStack_58 = plVar2[3];
        local_70 = &local_60;
      }
      else {
        local_60 = *plVar5;
      }
      local_68 = plVar2[1];
      *plVar2 = (long)plVar5;
      plVar2[1] = 0;
      *(undefined1 *)(plVar2 + 2) = 0;
      std::runtime_error::runtime_error(prVar4,(string *)&local_70);
      __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    plVar2 = (long *)plVar2[3];
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    lVar3 = *plVar2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,lVar3,plVar2[1] + lVar3);
    if (this_01 != (_Base_ptr)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_01);
    }
    if (this_00 != (_Base_ptr)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_00);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string ParamSet::getParamString(const std::string &name) const
    {
      std::map<std::string,std::shared_ptr<Param> >::const_iterator it=param.find(name);
      if (it == param.end())
        return "";
      std::shared_ptr<Param> pr = it->second;
      const std::shared_ptr<ParamArray<std::string>> p = std::dynamic_pointer_cast<ParamArray<std::string>>(pr);
      if (!p)
        throw std::runtime_error("str: found param of given name ("+name+"), but of wrong type!");
      if (p->getSize() != 1)
        throw std::runtime_error("found param of given name and type, but wrong number of components! (str, name='"+name+"'");
      return p->get(0);
    }